

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleanup_state.cpp
# Opt level: O3

void __thiscall
duckdb::CleanupState::CleanupEntry(CleanupState *this,UndoFlags type,data_ptr_t data)

{
  CatalogEntry *catalog_entry;
  
  switch(type) {
  case CATALOG_ENTRY:
    catalog_entry = *(CatalogEntry **)data;
    optional_ptr<duckdb::CatalogSet,_true>::CheckValid(&catalog_entry->set);
    CatalogSet::CleanupEntry((catalog_entry->set).ptr,catalog_entry);
    return;
  case INSERT_TUPLE:
    DataTable::CleanupAppend
              (*(DataTable **)data,this->lowest_active_transaction,*(idx_t *)(data + 8),
               *(idx_t *)(data + 0x10));
    return;
  case DELETE_TUPLE:
    CleanupDelete(this,(DeleteInfo *)data);
    return;
  case UPDATE_TUPLE:
    UpdateSegment::CleanupUpdate(*(UpdateSegment **)data,(UpdateInfo *)data);
    return;
  default:
    return;
  }
}

Assistant:

void CleanupState::CleanupEntry(UndoFlags type, data_ptr_t data) {
	switch (type) {
	case UndoFlags::CATALOG_ENTRY: {
		auto catalog_entry = Load<CatalogEntry *>(data);
		D_ASSERT(catalog_entry);
		auto &entry = *catalog_entry;
		D_ASSERT(entry.set);
		entry.set->CleanupEntry(entry);
		break;
	}
	case UndoFlags::INSERT_TUPLE: {
		auto info = reinterpret_cast<AppendInfo *>(data);
		// mark the tuples as committed
		info->table->CleanupAppend(lowest_active_transaction, info->start_row, info->count);
		break;
	}
	case UndoFlags::DELETE_TUPLE: {
		auto info = reinterpret_cast<DeleteInfo *>(data);
		CleanupDelete(*info);
		break;
	}
	case UndoFlags::UPDATE_TUPLE: {
		auto info = reinterpret_cast<UpdateInfo *>(data);
		CleanupUpdate(*info);
		break;
	}
	default:
		break;
	}
}